

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Export * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::erase
          (Export *__return_storage_ptr__,
          ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *this,
          uint id,Export *entry)

{
  bool bVar1;
  Entry **ppEVar2;
  Export *pEVar3;
  Export local_128;
  undefined1 local_e9;
  Fault local_e8;
  Fault f;
  Entry *local_d8;
  Export *local_d0;
  undefined1 local_c8 [8];
  DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*>
  _kjCondition;
  Export local_98;
  Entry *local_60;
  Fault local_48;
  Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry_&>
  local_40;
  Entry *local_38;
  Entry *_kj_result;
  Entry *slot;
  Export *entry_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *pEStack_18;
  uint id_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *this_local;
  Export *toRelease;
  
  slot = (Entry *)entry;
  entry_local._4_4_ = id;
  pEStack_18 = this;
  this_local = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
               __return_storage_ptr__;
  bVar1 = isHigh(this,(uint *)((long)&entry_local + 4));
  if (bVar1) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::
    findEntry<unsigned_int&>
              ((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
               &local_40,(uint *)&this->highSlots);
    local_38 = kj::_::
               readMaybe<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
                         (&local_40);
    if (local_38 == (Entry *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xed,FAILED,"highSlots.findEntry(id) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    ppEVar2 = kj::
              mv<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry*>
                        (&local_38);
    local_60 = *ppEVar2;
    _kj_result = local_60;
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::release
              ((Entry *)&_kjCondition.result,&this->highSlots,local_60);
    RpcSystemBase::RpcConnectionState::Export::Export(__return_storage_ptr__,&local_98);
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry::~Entry
              ((Entry *)&_kjCondition.result);
  }
  else {
    local_d8 = slot;
    local_d0 = (Export *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Export **)&local_d8);
    f.exception = (Exception *)
                  kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export>::operator[]
                            (&this->slots,(ulong)entry_local._4_4_);
    kj::_::DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Export*>::operator==
              ((DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*>
                *)local_c8,
               (DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Export*> *)&local_d0,
               (Export **)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Export*,capnp::_::RpcSystemBase::RpcConnectionState::Export*>&>
                (&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xf0,FAILED,"&entry == &slots[id]","_kjCondition,",
                 (DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*>
                  *)local_c8);
      kj::_::Debug::Fault::fatal(&local_e8);
    }
    local_e9 = 0;
    pEVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export>::operator[]
                       (&this->slots,(ulong)entry_local._4_4_);
    pEVar3 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Export>(pEVar3);
    RpcSystemBase::RpcConnectionState::Export::Export(__return_storage_ptr__,pEVar3);
    local_128.resolveOp.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    local_128.vineInfo.ptr.disposer = (Disposer *)0x0;
    local_128.clientHook.ptr = (ClientHook *)0x0;
    local_128.resolveOp.ptr.isSet = false;
    local_128.resolveOp.ptr._1_7_ = 0;
    local_128.refcount = 0;
    local_128.canonical = false;
    local_128._5_3_ = 0;
    local_128.clientHook.disposer = (Disposer *)0x0;
    local_128.vineInfo.ptr.ptr = (VineInfo *)0x0;
    RpcSystemBase::RpcConnectionState::Export::Export(&local_128);
    pEVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Export>::operator[]
                       (&this->slots,(ulong)entry_local._4_4_);
    RpcSystemBase::RpcConnectionState::Export::operator=(pEVar3,&local_128);
    RpcSystemBase::RpcConnectionState::Export::~Export(&local_128);
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this->freeIds,(value_type *)((long)&entry_local + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }